

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::cmCTest(cmCTest *this)

{
  mapped_type mVar1;
  bool bVar2;
  Private *this_00;
  pointer pPVar3;
  pointer pPVar4;
  string *s;
  mapped_type *pmVar5;
  reference ppcVar6;
  cmCTestGenericHandler **handler;
  iterator __end1;
  iterator __begin1;
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *__range1;
  mapped_type local_240;
  allocator<char> local_239;
  Part p;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  string_view local_60;
  string_view local_50;
  undefined1 local_40 [8];
  string envValue;
  cmCTest *this_local;
  
  this_00 = (Private *)operator_new(0x2a50);
  Private::Private(this_00);
  std::unique_ptr<cmCTest::Private,std::default_delete<cmCTest::Private>>::
  unique_ptr<std::default_delete<cmCTest::Private>,void>
            ((unique_ptr<cmCTest::Private,std::default_delete<cmCTest::Private>> *)this,this_00);
  std::__cxx11::string::string((string *)local_40);
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE",(string *)local_40);
  if (bVar2) {
    local_50 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
    bVar2 = cmIsOff(local_50);
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar3->OutputTestOutputOnTestFailure = (bool)((bVar2 ^ 0xffU) & 1);
  }
  std::__cxx11::string::clear();
  bVar2 = cmsys::SystemTools::GetEnv("CTEST_PROGRESS_OUTPUT",(string *)local_40);
  if (bVar2) {
    local_60 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
    bVar2 = cmIsOff(local_60);
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar3->TestProgressOutput = (bool)((bVar2 ^ 0xffU) & 1);
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Start",&local_81);
  Private::PartInfo::SetName(pPVar3->Parts,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Update",&local_a9);
  Private::PartInfo::SetName(pPVar3->Parts + 1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Configure",&local_d1);
  Private::PartInfo::SetName(pPVar3->Parts + 2,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Build",&local_f9);
  Private::PartInfo::SetName(pPVar3->Parts + 3,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Test",&local_121);
  Private::PartInfo::SetName(pPVar3->Parts + 4,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Coverage",&local_149);
  Private::PartInfo::SetName(pPVar3->Parts + 5,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"MemCheck",&local_171);
  Private::PartInfo::SetName(pPVar3->Parts + 6,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"Submit",&local_199);
  Private::PartInfo::SetName(pPVar3->Parts + 7,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"Notes",&local_1c1);
  Private::PartInfo::SetName(pPVar3->Parts + 8,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"ExtraFiles",&local_1e9);
  Private::PartInfo::SetName(pPVar3->Parts + 9,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"Upload",&local_211);
  Private::PartInfo::SetName(pPVar3->Parts + 10,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&p,"Done",&local_239);
  Private::PartInfo::SetName(pPVar3->Parts + 0xb,(string *)&p);
  std::__cxx11::string::~string((string *)&p);
  std::allocator<char>::~allocator(&local_239);
  for (local_240 = PartStart; mVar1 = local_240, local_240 != PartCount;
      local_240 = local_240 + PartUpdate) {
    pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    pPVar4 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                       (&this->Impl);
    s = Private::PartInfo::GetName_abi_cxx11_(pPVar4->Parts + local_240);
    cmsys::SystemTools::LowerCase((string *)&__range1,s);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
             ::operator[](&pPVar3->PartMap,(key_type *)&__range1);
    *pmVar5 = mVar1;
    std::__cxx11::string::~string((string *)&__range1);
  }
  pPVar3 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  Private::GetTestingHandlers
            ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)&__begin1,
             pPVar3);
  __end1 = std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::begin
                     ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                      &__begin1);
  handler = (cmCTestGenericHandler **)
            std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::end
                      ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                       &__begin1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
                                *)&handler);
    if (!bVar2) break;
    ppcVar6 = __gnu_cxx::
              __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
              ::operator*(&__end1);
    cmCTestGenericHandler::SetCTestInstance(*ppcVar6,this);
    __gnu_cxx::
    __normal_iterator<cmCTestGenericHandler_**,_std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::~vector
            ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)&__begin1)
  ;
  cmSystemTools::EnableVSConsoleOutput();
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

cmCTest::cmCTest()
  : Impl(new Private)
{
  std::string envValue;
  if (cmSystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE", envValue)) {
    this->Impl->OutputTestOutputOnTestFailure = !cmIsOff(envValue);
  }
  envValue.clear();
  if (cmSystemTools::GetEnv("CTEST_PROGRESS_OUTPUT", envValue)) {
    this->Impl->TestProgressOutput = !cmIsOff(envValue);
  }

  this->Impl->Parts[PartStart].SetName("Start");
  this->Impl->Parts[PartUpdate].SetName("Update");
  this->Impl->Parts[PartConfigure].SetName("Configure");
  this->Impl->Parts[PartBuild].SetName("Build");
  this->Impl->Parts[PartTest].SetName("Test");
  this->Impl->Parts[PartCoverage].SetName("Coverage");
  this->Impl->Parts[PartMemCheck].SetName("MemCheck");
  this->Impl->Parts[PartSubmit].SetName("Submit");
  this->Impl->Parts[PartNotes].SetName("Notes");
  this->Impl->Parts[PartExtraFiles].SetName("ExtraFiles");
  this->Impl->Parts[PartUpload].SetName("Upload");
  this->Impl->Parts[PartDone].SetName("Done");

  // Fill the part name-to-id map.
  for (Part p = PartStart; p != PartCount; p = static_cast<Part>(p + 1)) {
    this->Impl
      ->PartMap[cmSystemTools::LowerCase(this->Impl->Parts[p].GetName())] = p;
  }

  for (auto& handler : this->Impl->GetTestingHandlers()) {
    handler->SetCTestInstance(this);
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();
}